

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fop_helper.c
# Opt level: O3

target_ulong do_check_ieee_exceptions(CPUSPARCState_conflict1 *env,uintptr_t ra)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  bVar1 = (env->fp_status).float_exception_flags;
  uVar2 = env->fsr;
  if (bVar1 == 0) {
    return uVar2;
  }
  (env->fp_status).float_exception_flags = '\0';
  uVar3 = bVar1 >> 5 & 1 | bVar1 >> 1 & 2 | bVar1 >> 2 & 4 | bVar1 & 8 | (bVar1 & 1) << 4;
  uVar4 = uVar3 | uVar2;
  if (((uint)((uVar2 & 0xffffffff) >> 0x17) & (uint)uVar4 & 0x1f) == 0) {
    return (uVar3 | (uint)uVar2 & 0x1f) << 5 | uVar4;
  }
  env->fsr = uVar4 | 0x4000;
  *(undefined4 *)(env[-1].regbase + 0x1c5) = 0x21;
  cpu_loop_exit_restore_sparc64((CPUState *)(env[-5].regbase + 0x201),ra);
}

Assistant:

static target_ulong do_check_ieee_exceptions(CPUSPARCState *env, uintptr_t ra)
{
    target_ulong status = get_float_exception_flags(&env->fp_status);
    target_ulong fsr = env->fsr;

    if (unlikely(status)) {
        /* Keep exception flags clear for next time.  */
        set_float_exception_flags(0, &env->fp_status);

        /* Copy IEEE 754 flags into FSR */
        if (status & float_flag_invalid) {
            fsr |= FSR_NVC;
        }
        if (status & float_flag_overflow) {
            fsr |= FSR_OFC;
        }
        if (status & float_flag_underflow) {
            fsr |= FSR_UFC;
        }
        if (status & float_flag_divbyzero) {
            fsr |= FSR_DZC;
        }
        if (status & float_flag_inexact) {
            fsr |= FSR_NXC;
        }

        if ((fsr & FSR_CEXC_MASK) & ((fsr & FSR_TEM_MASK) >> 23)) {
            CPUState *cs = env_cpu(env);

            /* Unmasked exception, generate a trap.  Note that while
               the helper is marked as NO_WG, we can get away with
               writing to cpu state along the exception path, since
               TCG generated code will never see the write.  */
            env->fsr = fsr | FSR_FTT_IEEE_EXCP;
            cs->exception_index = TT_FP_EXCP;
            cpu_loop_exit_restore(cs, ra);
        } else {
            /* Accumulate exceptions */
            fsr |= (fsr & FSR_CEXC_MASK) << 5;
        }
    }

    return fsr;
}